

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  real *prVar1;
  float *pfVar2;
  Vector *in_RDX;
  __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  double dVar3;
  int32_t i_2;
  int32_t i_1;
  int32_t i;
  real z;
  real max;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar5;
  float fVar6;
  float in_stack_ffffffffffffffe4;
  real rVar7;
  
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_RDI);
  Vector::mul((Vector *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              (Matrix *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
              (Vector *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  prVar1 = Vector::operator[](in_RDX,0);
  rVar7 = *prVar1;
  fVar5 = 0.0;
  for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0x68); iVar4 = iVar4 + 1) {
    prVar1 = Vector::operator[](in_RDX,(long)iVar4);
    pfVar2 = std::max<float>(prVar1,(float *)&stack0xffffffffffffffe4);
    rVar7 = *pfVar2;
  }
  for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0x68); iVar4 = iVar4 + 1) {
    prVar1 = Vector::operator[](in_RDX,(long)iVar4);
    dVar3 = exp((double)(*prVar1 - rVar7));
    prVar1 = Vector::operator[](in_RDX,(long)iVar4);
    *prVar1 = (float)dVar3;
    prVar1 = Vector::operator[](in_RDX,(long)iVar4);
    fVar5 = *prVar1 + fVar5;
  }
  for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0x68); iVar4 = iVar4 + 1) {
    fVar6 = fVar5;
    prVar1 = Vector::operator[](in_RDX,(long)iVar4);
    *prVar1 = *prVar1 / fVar5;
    fVar5 = fVar6;
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
  output.mul(*wo_, hidden);
  real max = output[0], z = 0.0;
  for (int32_t i = 0; i < osz_; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] /= z;
  }
}